

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

QList<QPointer<QWidget>_> * __thiscall
QMenuPrivate::calcCausedStack(QList<QPointer<QWidget>_> *__return_storage_ptr__,QMenuPrivate *this)

{
  Data *pDVar1;
  QPointer<QWidget> *b;
  long lVar2;
  long lVar3;
  QObject *pQVar4;
  long in_FS_OFFSET;
  QPointer<QWidget> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QPointer<QWidget> *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pDVar1 = (this->causedPopup).widget.wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar4 = (QObject *)0x0;
  }
  else {
    pQVar4 = (this->causedPopup).widget.wp.value;
  }
  do {
    if (pQVar4 == (QObject *)0x0) break;
    local_40.wp.d = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar4);
    local_40.wp.value = pQVar4;
    QtPrivate::QMovableArrayOps<QPointer<QWidget>>::emplace<QPointer<QWidget>>
              ((QMovableArrayOps<QPointer<QWidget>> *)__return_storage_ptr__,
               (__return_storage_ptr__->d).size,&local_40);
    QList<QPointer<QWidget>_>::end(__return_storage_ptr__);
    if (local_40.wp.d != (Data *)0x0) {
      LOCK();
      *(int *)local_40.wp.d = *(int *)local_40.wp.d + -1;
      UNLOCK();
      if ((*(int *)local_40.wp.d == 0) && (local_40.wp.d != (Data *)0x0)) {
        operator_delete(local_40.wp.d);
      }
    }
    lVar3 = QMetaObject::cast((QObject *)&QTornOffMenu::staticMetaObject);
    if (lVar3 != 0) {
      b = *(QPointer<QWidget> **)(*(long *)(lVar3 + 8) + 0x440);
      QtPrivate::QCommonArrayOps<QPointer<QWidget>_>::growAppend
                ((QCommonArrayOps<QPointer<QWidget>_> *)__return_storage_ptr__,b,
                 b + *(long *)(*(long *)(lVar3 + 8) + 0x448));
    }
    lVar3 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
    if (lVar3 != 0) {
      lVar2 = *(long *)(*(long *)(lVar3 + 8) + 0x2f8);
      if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
        pQVar4 = (QObject *)0x0;
      }
      else {
        pQVar4 = *(QObject **)(*(long *)(lVar3 + 8) + 0x300);
      }
    }
  } while (lVar3 != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QPointer<QWidget>> QMenuPrivate::calcCausedStack() const
{
    QList<QPointer<QWidget>> ret;
    for(QWidget *widget = causedPopup.widget; widget; ) {
        ret.append(widget);
        if (QTornOffMenu *qtmenu = qobject_cast<QTornOffMenu*>(widget))
            ret += qtmenu->d_func()->causedStack;
        if (QMenu *qmenu = qobject_cast<QMenu*>(widget))
            widget = qmenu->d_func()->causedPopup.widget;
        else
            break;
    }
    return ret;
}